

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynomial.cpp
# Opt level: O1

Integer mathiu::impl::degree(ExprPtr *ex,ExprPtr *varSet)

{
  _Variadic_union<matchit::impl::IdBlock<mathiu::impl::Sum>_*> _Var1;
  element_type *peVar2;
  bool bVar3;
  Integer IVar4;
  ostream *poVar5;
  long lVar6;
  variant_alternative_t<1UL,_variant<monostate,_const_Set_*,_bool>_> *value;
  __visit_result_t<matchit::impl::Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>,_std::variant<matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>_&>
  pIVar7;
  _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  *p_Var8;
  variant_alternative_t<1UL,_variant<monostate,_const_Sum_*,_bool>_> *value_00;
  __visit_result_t<matchit::impl::Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>,_std::variant<matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>_&>
  pIVar9;
  __visit_result_t<matchit::impl::Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1189:33)>,_const_std::variant<std::monostate,_mathiu::impl::Sum,_mathiu::impl::Sum_*,_const_mathiu::impl::Sum_*>_&>
  pSVar10;
  _Base_ptr p_Var11;
  ExprPtr *ex_00;
  ExprPtr *ex_01;
  IdProcess IVar12;
  int iVar13;
  size_t *psVar14;
  _Rb_tree_header *p_Var15;
  initializer_list<std::shared_ptr<const_mathiu::impl::Expr>_> __l;
  ContextT context;
  Id<mathiu::impl::Sum> iS;
  Id<mathiu::impl::Set> iSet;
  allocator_type local_32a;
  ExprPtrLess local_329;
  _Variadic_union<std::monostate,_const_mathiu::impl::Sum_*,_bool> local_328;
  _Rb_tree_node_base _Stack_320;
  size_t sStack_300;
  undefined1 local_2f8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  long local_2d8;
  ExprPtr *local_2d0;
  undefined1 local_2c8 [8];
  _Move_ctor_base<false,_std::monostate,_mathiu::impl::Sum,_mathiu::impl::Sum_*,_const_mathiu::impl::Sum_*>
  local_2c0;
  __index_type local_288;
  _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  local_280;
  undefined1 local_250 [16];
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
  local_240;
  anon_class_1_0_00000001 *local_1f8;
  InternalPatternT<bool> IStack_1f0;
  undefined7 uStack_1ef;
  undefined1 local_1e8 [8];
  undefined1 auStack_1e0 [8];
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
  _Stack_1d8;
  App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>
  local_190;
  Id<mathiu::impl::Set> *local_180;
  _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  *local_178;
  App<const_matchit::impl::AsPointer<mathiu::impl::Set>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>_>
  local_170;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
  local_108;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
  local_c0;
  undefined1 local_78 [64];
  __index_type local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"degree: ",8);
  local_2d0 = ex;
  toString_abi_cxx11_((string *)local_1e8,(impl *)ex,ex_00);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_1e8,(long)auStack_1e0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,",\t",2);
  toString_abi_cxx11_((string *)local_250,(impl *)varSet,ex_01);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(char *)local_250._0_8_,local_250._8_8_);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if ((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
       *)local_250._0_8_ != &local_240) {
    operator_delete((void *)local_250._0_8_,(long)local_240._M_u._M_rest + 1);
  }
  if (local_1e8 != (undefined1  [8])&_Stack_1d8) {
    operator_delete((void *)local_1e8,(long)_Stack_1d8._M_u._M_rest + 1);
  }
  local_1e8 = (undefined1  [8])((ulong)local_1e8 & 0xffffffff00000000);
  auStack_1e0 = (undefined1  [8])0x0;
  _Stack_1d8._M_u._M_rest = (_Variadic_union<matchit::impl::IdBlock<mathiu::impl::Set>_*>)0x0;
  _Stack_1d8._M_u._8_8_ = 0;
  _Stack_1d8._M_u._16_8_ = 0;
  _Stack_1d8._M_u._24_8_ = 0;
  _Stack_1d8._M_u._32_8_ = 0;
  _Stack_1d8._M_u._40_8_ = 0;
  local_78._0_4_ = 0;
  std::__detail::__variant::
  _Move_ctor_base<false,_std::monostate,_mathiu::impl::Set,_mathiu::impl::Set_*,_const_mathiu::impl::Set_*>
  ::_Move_ctor_base((_Move_ctor_base<false,_std::monostate,_mathiu::impl::Set,_mathiu::impl::Set_*,_const_mathiu::impl::Set_*>
                     *)(local_78 + 8),
                    (_Move_ctor_base<false,_std::monostate,_mathiu::impl::Set,_mathiu::impl::Set_*,_const_mathiu::impl::Set_*>
                     *)auStack_1e0);
  local_38 = '\0';
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_mathiu::impl::Set,_mathiu::impl::Set_*,_const_mathiu::impl::Set_*>
  ::~_Variant_storage((_Variant_storage<false,_std::monostate,_mathiu::impl::Set,_mathiu::impl::Set_*,_const_mathiu::impl::Set_*>
                       *)auStack_1e0);
  _Var1._M_first._M_storage =
       (_Uninitialized<matchit::impl::IdBlock<mathiu::impl::Sum>_*,_true>)
       (varSet->super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  matchit::impl::Id<mathiu::impl::Set>::Id
            ((Id<mathiu::impl::Set> *)&local_c0,(Id<mathiu::impl::Set> *)local_78);
  matchit::impl::as<mathiu::impl::Set>::{lambda(auto:1)#1}::operator()
            (&local_170,(_lambda_auto_1__1_ *)&matchit::impl::as<mathiu::impl::Set>,
             (Id<mathiu::impl::Set> *)&local_c0);
  local_250._0_8_ = local_170.mUnary;
  local_250._8_8_ =
       local_170.mPattern.mPatterns.
       super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>
       .
       super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>
       .
       super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>,_false>
       ._M_head_impl.mUnary;
  matchit::impl::Id<mathiu::impl::Set>::Id
            ((Id<mathiu::impl::Set> *)&local_240,
             (InternalPatternT<matchit::impl::Id<mathiu::impl::Set>_> *)
             ((long)&local_170.mPattern.mPatterns.
                     super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>
                     .
                     super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>
                     .
                     super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>,_false>
             + 8));
  local_1f8 = local_170.mPattern.mPatterns.
              super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>
              .
              super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
              ._M_head_impl.mUnary;
  IStack_1f0 = local_170.mPattern.mPatterns.
               super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>
               .
               super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
               ._M_head_impl.mPattern;
  uStack_1ef = local_170.mPattern.mPatterns.
               super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>
               .
               super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
               ._M_head_impl._9_7_;
  local_1e8 = (undefined1  [8])local_250._0_8_;
  auStack_1e0 = (undefined1  [8])local_250._8_8_;
  matchit::impl::Id<mathiu::impl::Set>::Id
            ((Id<mathiu::impl::Set> *)&_Stack_1d8,(Id<mathiu::impl::Set> *)&local_240);
  local_190.mUnary = local_1f8;
  local_190.mPattern = IStack_1f0;
  local_190._9_7_ = uStack_1ef;
  _Stack_320._M_parent = (_Base_ptr)0x0;
  local_328 = (_Variadic_union<std::monostate,_const_mathiu::impl::Sum_*,_bool>)0x0;
  _Stack_320._M_color = _S_red;
  _Stack_320._4_4_ = 0;
  psVar14 = &sStack_300;
  sStack_300 = 0;
  local_2e8 = 0;
  uStack_2e0 = 0;
  local_2f8 = (undefined1  [8])0x0;
  p_Stack_2f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  lVar6 = 8;
  do {
    *(undefined1 *)((long)&sStack_300 + lVar6 + 8) = 0;
    lVar6 = lVar6 + 0x10;
  } while (lVar6 != 0x28);
  local_2d8 = 0;
  local_2c8 = (undefined1  [8])(_Variadic_union<matchit::impl::IdBlock<mathiu::impl::Sum>_*>)0x0;
  if (*(__index_type *)((long)_Var1 + 0x38) == '\r') {
    local_2c8 = (undefined1  [8])_Var1._M_first._M_storage;
  }
  _Stack_320._M_left = &_Stack_320;
  _Stack_320._M_right = &_Stack_320;
  local_180 = (Id<mathiu::impl::Set> *)local_78;
  std::variant<std::monostate,mathiu::impl::Set_const*,bool>::operator=
            ((variant<std::monostate,mathiu::impl::Set_const*,bool> *)local_2f8,(Set **)local_2c8);
  lVar6 = local_2d8 * 0x10;
  local_2d8 = local_2d8 + 1;
  value = std::get<1ul,std::monostate,mathiu::impl::Set_const*,bool>
                    ((variant<std::monostate,_const_mathiu::impl::Set_*,_bool> *)
                     ((long)&sStack_300 + lVar6 + 8));
  bVar3 = matchit::impl::
          PatternTraits<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>>
          ::
          matchPatternImpl<mathiu::impl::Set_const*&,matchit::impl::Context<mathiu::impl::Set_const*,bool>>
                    (value,&local_190,2,(Context<const_mathiu::impl::Set_*,_bool> *)local_2f8);
  if (bVar3) {
    bVar3 = matchit::impl::Id<mathiu::impl::Set>::matchValue<mathiu::impl::Set_const&>
                      ((Id<mathiu::impl::Set> *)&_Stack_1d8,*value);
    IVar12 = (IdProcess)bVar3;
    matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Set>_>::processIdImpl
              ((Id<mathiu::impl::Set> *)&_Stack_1d8,3,IVar12);
    matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Set>_>::processIdImpl
              ((Id<mathiu::impl::Set> *)&_Stack_1d8,2,(uint)bVar3);
  }
  else {
    IVar12 = kCANCEL;
  }
  matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Set>_>::processIdImpl
            ((Id<mathiu::impl::Set> *)&_Stack_1d8,1,IVar12);
  matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Set>_>::processIdImpl
            ((Id<mathiu::impl::Set> *)&_Stack_1d8,0,IVar12);
  if (IVar12 != kCANCEL) {
    pIVar7 = std::
             visit<matchit::impl::Overload<matchit::impl::Id<mathiu::impl::Set>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Set>&)_1_,matchit::impl::Id<mathiu::impl::Set>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Set>*)_1_>,std::variant<matchit::impl::IdBlock<mathiu::impl::Set>,matchit::impl::IdBlock<mathiu::impl::Set>*>&>
                       ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                         *)local_2c8,&local_180->mBlock);
    p_Var8 = (_Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
              *)std::
                visit<matchit::impl::Overload<matchit::impl::IdBlock<mathiu::impl::Set>::get()const::_lambda(mathiu::impl::Set_const&)_1_,matchit::impl::IdBlock<mathiu::impl::Set>::get()const::_lambda(mathiu::impl::Set_const*)_1_,matchit::impl::IdBlock<mathiu::impl::Set>::get()const::_lambda(mathiu::impl::Set*)_1_,matchit::impl::IdBlock<mathiu::impl::Set>::get()const::_lambda(std::monostate_const&)_1_>,std::variant<std::monostate,mathiu::impl::Set,mathiu::impl::Set*,mathiu::impl::Set_const*>const&>
                          ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1189:33)>
                            *)local_2c8,&(pIVar7->super_IdBlockBase<mathiu::impl::Set>).mVariant);
    std::
    _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
    ::_Rb_tree((_Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
                *)local_2c8,p_Var8);
    std::
    _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
    ::clear((_Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
             *)&local_328);
    if ((_Base_ptr)
        local_2c0.
        super__Copy_ctor_alias<std::monostate,_mathiu::impl::Sum,_mathiu::impl::Sum_*,_const_mathiu::impl::Sum_*>
        .
        super__Variant_storage_alias<std::monostate,_mathiu::impl::Sum,_mathiu::impl::Sum_*,_const_mathiu::impl::Sum_*>
        ._M_u._8_8_ != (_Base_ptr)0x0) {
      _Stack_320._M_color =
           local_2c0.
           super__Copy_ctor_alias<std::monostate,_mathiu::impl::Sum,_mathiu::impl::Sum_*,_const_mathiu::impl::Sum_*>
           .
           super__Variant_storage_alias<std::monostate,_mathiu::impl::Sum,_mathiu::impl::Sum_*,_const_mathiu::impl::Sum_*>
           ._M_u._0_4_;
      _Stack_320._M_parent =
           (_Base_ptr)
           local_2c0.
           super__Copy_ctor_alias<std::monostate,_mathiu::impl::Sum,_mathiu::impl::Sum_*,_const_mathiu::impl::Sum_*>
           .
           super__Variant_storage_alias<std::monostate,_mathiu::impl::Sum,_mathiu::impl::Sum_*,_const_mathiu::impl::Sum_*>
           ._M_u._8_8_;
      _Stack_320._M_left =
           (_Base_ptr)
           local_2c0.
           super__Copy_ctor_alias<std::monostate,_mathiu::impl::Sum,_mathiu::impl::Sum_*,_const_mathiu::impl::Sum_*>
           .
           super__Variant_storage_alias<std::monostate,_mathiu::impl::Sum,_mathiu::impl::Sum_*,_const_mathiu::impl::Sum_*>
           ._M_u._16_8_;
      _Stack_320._M_right =
           (_Base_ptr)
           local_2c0.
           super__Copy_ctor_alias<std::monostate,_mathiu::impl::Sum,_mathiu::impl::Sum_*,_const_mathiu::impl::Sum_*>
           .
           super__Variant_storage_alias<std::monostate,_mathiu::impl::Sum,_mathiu::impl::Sum_*,_const_mathiu::impl::Sum_*>
           ._M_u._24_8_;
      *(_Rb_tree_node_base **)
       (local_2c0.
        super__Copy_ctor_alias<std::monostate,_mathiu::impl::Sum,_mathiu::impl::Sum_*,_const_mathiu::impl::Sum_*>
        .
        super__Variant_storage_alias<std::monostate,_mathiu::impl::Sum,_mathiu::impl::Sum_*,_const_mathiu::impl::Sum_*>
        ._M_u._8_8_ + 8) = &_Stack_320;
      sStack_300 = local_2c0.
                   super__Copy_ctor_alias<std::monostate,_mathiu::impl::Sum,_mathiu::impl::Sum_*,_const_mathiu::impl::Sum_*>
                   .
                   super__Variant_storage_alias<std::monostate,_mathiu::impl::Sum,_mathiu::impl::Sum_*,_const_mathiu::impl::Sum_*>
                   ._M_u._32_8_;
      local_2c0.
      super__Copy_ctor_alias<std::monostate,_mathiu::impl::Sum,_mathiu::impl::Sum_*,_const_mathiu::impl::Sum_*>
      .
      super__Variant_storage_alias<std::monostate,_mathiu::impl::Sum,_mathiu::impl::Sum_*,_const_mathiu::impl::Sum_*>
      ._M_u._8_8_ = (_Base_ptr)0x0;
      local_2c0.
      super__Copy_ctor_alias<std::monostate,_mathiu::impl::Sum,_mathiu::impl::Sum_*,_const_mathiu::impl::Sum_*>
      .
      super__Variant_storage_alias<std::monostate,_mathiu::impl::Sum,_mathiu::impl::Sum_*,_const_mathiu::impl::Sum_*>
      ._M_u._32_8_ = 0;
      local_2c0.
      super__Copy_ctor_alias<std::monostate,_mathiu::impl::Sum,_mathiu::impl::Sum_*,_const_mathiu::impl::Sum_*>
      .
      super__Variant_storage_alias<std::monostate,_mathiu::impl::Sum,_mathiu::impl::Sum_*,_const_mathiu::impl::Sum_*>
      ._M_u._16_8_ = (_Rb_tree_node_base *)(local_2c8 + 8);
      local_2c0.
      super__Copy_ctor_alias<std::monostate,_mathiu::impl::Sum,_mathiu::impl::Sum_*,_const_mathiu::impl::Sum_*>
      .
      super__Variant_storage_alias<std::monostate,_mathiu::impl::Sum,_mathiu::impl::Sum_*,_const_mathiu::impl::Sum_*>
      ._M_u._24_8_ = (_Rb_tree_node_base *)(local_2c8 + 8);
    }
    std::
    _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
    ::~_Rb_tree((_Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
                 *)local_2c8);
    if (IVar12 != kCANCEL) goto LAB_001c65f7;
  }
  local_2f8 = (undefined1  [8])
              (varSet->super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
  p_Stack_2f0 = (varSet->super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
  if (p_Stack_2f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Stack_2f0->_M_use_count = p_Stack_2f0->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Stack_2f0->_M_use_count = p_Stack_2f0->_M_use_count + 1;
    }
  }
  __l._M_len = 1;
  __l._M_array = (iterator)local_2f8;
  std::
  set<std::shared_ptr<const_mathiu::impl::Expr>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  ::set((set<std::shared_ptr<const_mathiu::impl::Expr>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
         *)local_2c8,__l,&local_329,&local_32a);
  if (p_Stack_2f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_2f0);
  }
  std::
  _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  ::clear((_Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
           *)&local_328);
  if ((_Base_ptr)
      local_2c0.
      super__Copy_ctor_alias<std::monostate,_mathiu::impl::Sum,_mathiu::impl::Sum_*,_const_mathiu::impl::Sum_*>
      .
      super__Variant_storage_alias<std::monostate,_mathiu::impl::Sum,_mathiu::impl::Sum_*,_const_mathiu::impl::Sum_*>
      ._M_u._8_8_ != (_Base_ptr)0x0) {
    _Stack_320._M_color =
         local_2c0.
         super__Copy_ctor_alias<std::monostate,_mathiu::impl::Sum,_mathiu::impl::Sum_*,_const_mathiu::impl::Sum_*>
         .
         super__Variant_storage_alias<std::monostate,_mathiu::impl::Sum,_mathiu::impl::Sum_*,_const_mathiu::impl::Sum_*>
         ._M_u._0_4_;
    _Stack_320._M_parent =
         (_Base_ptr)
         local_2c0.
         super__Copy_ctor_alias<std::monostate,_mathiu::impl::Sum,_mathiu::impl::Sum_*,_const_mathiu::impl::Sum_*>
         .
         super__Variant_storage_alias<std::monostate,_mathiu::impl::Sum,_mathiu::impl::Sum_*,_const_mathiu::impl::Sum_*>
         ._M_u._8_8_;
    _Stack_320._M_left =
         (_Base_ptr)
         local_2c0.
         super__Copy_ctor_alias<std::monostate,_mathiu::impl::Sum,_mathiu::impl::Sum_*,_const_mathiu::impl::Sum_*>
         .
         super__Variant_storage_alias<std::monostate,_mathiu::impl::Sum,_mathiu::impl::Sum_*,_const_mathiu::impl::Sum_*>
         ._M_u._16_8_;
    _Stack_320._M_right =
         (_Base_ptr)
         local_2c0.
         super__Copy_ctor_alias<std::monostate,_mathiu::impl::Sum,_mathiu::impl::Sum_*,_const_mathiu::impl::Sum_*>
         .
         super__Variant_storage_alias<std::monostate,_mathiu::impl::Sum,_mathiu::impl::Sum_*,_const_mathiu::impl::Sum_*>
         ._M_u._24_8_;
    *(_Rb_tree_node_base **)
     (local_2c0.
      super__Copy_ctor_alias<std::monostate,_mathiu::impl::Sum,_mathiu::impl::Sum_*,_const_mathiu::impl::Sum_*>
      .
      super__Variant_storage_alias<std::monostate,_mathiu::impl::Sum,_mathiu::impl::Sum_*,_const_mathiu::impl::Sum_*>
      ._M_u._8_8_ + 8) = &_Stack_320;
    sStack_300 = local_2c0.
                 super__Copy_ctor_alias<std::monostate,_mathiu::impl::Sum,_mathiu::impl::Sum_*,_const_mathiu::impl::Sum_*>
                 .
                 super__Variant_storage_alias<std::monostate,_mathiu::impl::Sum,_mathiu::impl::Sum_*,_const_mathiu::impl::Sum_*>
                 ._M_u._32_8_;
    local_2c0.
    super__Copy_ctor_alias<std::monostate,_mathiu::impl::Sum,_mathiu::impl::Sum_*,_const_mathiu::impl::Sum_*>
    .
    super__Variant_storage_alias<std::monostate,_mathiu::impl::Sum,_mathiu::impl::Sum_*,_const_mathiu::impl::Sum_*>
    ._M_u._8_8_ = (_Base_ptr)0x0;
    local_2c0.
    super__Copy_ctor_alias<std::monostate,_mathiu::impl::Sum,_mathiu::impl::Sum_*,_const_mathiu::impl::Sum_*>
    .
    super__Variant_storage_alias<std::monostate,_mathiu::impl::Sum,_mathiu::impl::Sum_*,_const_mathiu::impl::Sum_*>
    ._M_u._32_8_ = 0;
    local_2c0.
    super__Copy_ctor_alias<std::monostate,_mathiu::impl::Sum,_mathiu::impl::Sum_*,_const_mathiu::impl::Sum_*>
    .
    super__Variant_storage_alias<std::monostate,_mathiu::impl::Sum,_mathiu::impl::Sum_*,_const_mathiu::impl::Sum_*>
    ._M_u._16_8_ = (_Rb_tree_node_base *)(local_2c8 + 8);
    local_2c0.
    super__Copy_ctor_alias<std::monostate,_mathiu::impl::Sum,_mathiu::impl::Sum_*,_const_mathiu::impl::Sum_*>
    .
    super__Variant_storage_alias<std::monostate,_mathiu::impl::Sum,_mathiu::impl::Sum_*,_const_mathiu::impl::Sum_*>
    ._M_u._24_8_ = (_Rb_tree_node_base *)(local_2c8 + 8);
  }
  std::
  _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
               *)local_2c8);
LAB_001c65f7:
  p_Var15 = (_Rb_tree_header *)((long)&local_280._M_impl + 8);
  if (_Stack_320._M_parent == (_Base_ptr)0x0) {
    psVar14 = (size_t *)((long)&local_280._M_impl + 0x28);
    local_280._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_280._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_280._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)p_Var15;
    local_280._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)p_Var15;
  }
  else {
    local_280._M_impl.super__Rb_tree_header._M_header._M_color = _Stack_320._M_color;
    local_280._M_impl.super__Rb_tree_header._M_header._M_parent = _Stack_320._M_parent;
    local_280._M_impl.super__Rb_tree_header._M_header._M_left = _Stack_320._M_left;
    local_280._M_impl.super__Rb_tree_header._M_header._M_right = _Stack_320._M_right;
    (_Stack_320._M_parent)->_M_parent = (_Base_ptr)p_Var15;
    local_280._M_impl.super__Rb_tree_header._M_node_count = sStack_300;
    _Stack_320._M_parent = (_Base_ptr)0x0;
    _Stack_320._M_left = &_Stack_320;
    _Stack_320._M_right = &_Stack_320;
  }
  *psVar14 = 0;
  std::
  _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
               *)&local_328);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
  ::~_Variant_storage(&_Stack_1d8);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
  ::~_Variant_storage(&local_240);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
                       *)((long)&local_170.mPattern.mPatterns.
                                 super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>
                                 .
                                 super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>
                                 .
                                 super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>,_false>
                         + 8));
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
  ::~_Variant_storage(&local_c0);
  local_1e8 = (undefined1  [8])((ulong)local_1e8 & 0xffffffff00000000);
  auStack_1e0 = (undefined1  [8])0x0;
  _Stack_1d8._M_u._M_rest = (_Variadic_union<matchit::impl::IdBlock<mathiu::impl::Set>_*>)0x0;
  _Stack_1d8._M_u._8_8_ = 0;
  _Stack_1d8._M_u._16_8_ = 0;
  _Stack_1d8._M_u._24_8_ = 0;
  _Stack_1d8._M_u._32_8_ = 0;
  _Stack_1d8._M_u._40_8_ = 0;
  local_2c8 = (undefined1  [8])((ulong)local_2c8 & 0xffffffff00000000);
  std::__detail::__variant::
  _Move_ctor_base<false,_std::monostate,_mathiu::impl::Sum,_mathiu::impl::Sum_*,_const_mathiu::impl::Sum_*>
  ::_Move_ctor_base((_Move_ctor_base<false,_std::monostate,_mathiu::impl::Sum,_mathiu::impl::Sum_*,_const_mathiu::impl::Sum_*>
                     *)(local_2c8 + 8),
                    (_Move_ctor_base<false,_std::monostate,_mathiu::impl::Sum,_mathiu::impl::Sum_*,_const_mathiu::impl::Sum_*>
                     *)auStack_1e0);
  local_288 = '\0';
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_mathiu::impl::Sum,_mathiu::impl::Sum_*,_const_mathiu::impl::Sum_*>
  ::~_Variant_storage((_Variant_storage<false,_std::monostate,_mathiu::impl::Sum,_mathiu::impl::Sum_*,_const_mathiu::impl::Sum_*>
                       *)auStack_1e0);
  peVar2 = (local_2d0->super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  matchit::impl::Id<mathiu::impl::Sum>::Id
            ((Id<mathiu::impl::Sum> *)&local_108,(Id<mathiu::impl::Sum> *)local_2c8);
  matchit::impl::as<mathiu::impl::Sum>::{lambda(auto:1)#1}::operator()
            ((App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>
              *)&local_170,(_lambda_auto_1__1_ *)&matchit::impl::as<mathiu::impl::Sum>,
             (Id<mathiu::impl::Sum> *)&local_108);
  local_250._0_8_ = local_170.mUnary;
  local_250._8_8_ =
       local_170.mPattern.mPatterns.
       super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>
       .
       super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>
       .
       super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>,_false>
       ._M_head_impl.mUnary;
  matchit::impl::Id<mathiu::impl::Sum>::Id
            ((Id<mathiu::impl::Sum> *)&local_240,
             (Id<mathiu::impl::Sum> *)
             ((long)&local_170.mPattern.mPatterns.
                     super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>
                     .
                     super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>
                     .
                     super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>,_false>
             + 8));
  local_1f8 = local_170.mPattern.mPatterns.
              super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>
              .
              super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
              ._M_head_impl.mUnary;
  IStack_1f0 = local_170.mPattern.mPatterns.
               super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>
               .
               super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
               ._M_head_impl.mPattern;
  uStack_1ef = local_170.mPattern.mPatterns.
               super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>
               .
               super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
               ._M_head_impl._9_7_;
  local_1e8 = (undefined1  [8])local_250._0_8_;
  auStack_1e0 = (undefined1  [8])local_250._8_8_;
  matchit::impl::Id<mathiu::impl::Sum>::Id
            ((Id<mathiu::impl::Sum> *)&_Stack_1d8,(Id<mathiu::impl::Sum> *)&local_240);
  local_190.mUnary = local_1f8;
  local_190.mPattern = IStack_1f0;
  local_190._9_7_ = uStack_1ef;
  local_178 = &local_280;
  _Stack_320._M_parent = (_Base_ptr)0x0;
  _Stack_320._M_left = (_Base_ptr)0x0;
  local_328 = (_Variadic_union<std::monostate,_const_mathiu::impl::Sum_*,_bool>)0x0;
  _Stack_320._M_color = _S_red;
  _Stack_320._4_4_ = 0;
  lVar6 = 8;
  do {
    *(undefined1 *)((long)&local_328 + lVar6) = 0;
    lVar6 = lVar6 + 0x10;
  } while (lVar6 != 0x28);
  _Stack_320._M_right = (_Base_ptr)0x0;
  local_2f8 = (undefined1  [8])(element_type *)0x0;
  if (*(__index_type *)((long)&peVar2->super_ExprVariant + 0x38) == '\a') {
    local_2f8 = (undefined1  [8])peVar2;
  }
  local_180 = (Id<mathiu::impl::Set> *)local_2c8;
  std::variant<std::monostate,mathiu::impl::Sum_const*,bool>::operator=
            ((variant<std::monostate,mathiu::impl::Sum_const*,bool> *)&local_328,(Sum **)local_2f8);
  lVar6 = (long)_Stack_320._M_right * 2;
  _Stack_320._M_right = (_Base_ptr)((long)&(_Stack_320._M_right)->_M_color + 1);
  value_00 = std::get<1ul,std::monostate,mathiu::impl::Sum_const*,bool>
                       ((variant<std::monostate,_const_mathiu::impl::Sum_*,_bool> *)
                        (&local_328 + lVar6));
  bVar3 = matchit::impl::
          PatternTraits<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>>
          ::
          matchPatternImpl<mathiu::impl::Sum_const*&,matchit::impl::Context<mathiu::impl::Sum_const*,bool>>
                    (value_00,&local_190,2,(Context<const_mathiu::impl::Sum_*,_bool> *)&local_328);
  if (bVar3) {
    bVar3 = matchit::impl::Id<mathiu::impl::Sum>::matchValue<mathiu::impl::Sum_const&>
                      ((Id<mathiu::impl::Sum> *)&_Stack_1d8,*value_00);
    IVar12 = (IdProcess)bVar3;
    matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Sum>_>::processIdImpl
              ((Id<mathiu::impl::Sum> *)&_Stack_1d8,3,IVar12);
    matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Sum>_>::processIdImpl
              ((Id<mathiu::impl::Sum> *)&_Stack_1d8,2,(uint)bVar3);
  }
  else {
    IVar12 = kCANCEL;
  }
  matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Sum>_>::processIdImpl
            ((Id<mathiu::impl::Sum> *)&_Stack_1d8,1,IVar12);
  iVar13 = 0;
  matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Sum>_>::processIdImpl
            ((Id<mathiu::impl::Sum> *)&_Stack_1d8,0,IVar12);
  if (IVar12 != kCANCEL) {
    pIVar9 = std::
             visit<matchit::impl::Overload<matchit::impl::Id<mathiu::impl::Sum>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Sum>&)_1_,matchit::impl::Id<mathiu::impl::Sum>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Sum>*)_1_>,std::variant<matchit::impl::IdBlock<mathiu::impl::Sum>,matchit::impl::IdBlock<mathiu::impl::Sum>*>&>
                       ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                         *)local_2f8,
                        (variant<matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
                         *)local_180);
    pSVar10 = std::
              visit<matchit::impl::Overload<matchit::impl::IdBlock<mathiu::impl::Sum>::get()const::_lambda(mathiu::impl::Sum_const&)_1_,matchit::impl::IdBlock<mathiu::impl::Sum>::get()const::_lambda(mathiu::impl::Sum_const*)_1_,matchit::impl::IdBlock<mathiu::impl::Sum>::get()const::_lambda(mathiu::impl::Sum*)_1_,matchit::impl::IdBlock<mathiu::impl::Sum>::get()const::_lambda(std::monostate_const&)_1_>,std::variant<std::monostate,mathiu::impl::Sum,mathiu::impl::Sum*,mathiu::impl::Sum_const*>const&>
                        ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1189:33)>
                          *)local_2f8,&(pIVar9->super_IdBlockBase<mathiu::impl::Sum>).mVariant);
    p_Var11 = (pSVar10->super_ExprPtrMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    pIVar9 = std::
             visit<matchit::impl::Overload<matchit::impl::Id<mathiu::impl::Sum>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Sum>&)_1_,matchit::impl::Id<mathiu::impl::Sum>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Sum>*)_1_>,std::variant<matchit::impl::IdBlock<mathiu::impl::Sum>,matchit::impl::IdBlock<mathiu::impl::Sum>*>&>
                       ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                         *)local_2f8,
                        (variant<matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
                         *)local_180);
    pSVar10 = std::
              visit<matchit::impl::Overload<matchit::impl::IdBlock<mathiu::impl::Sum>::get()const::_lambda(mathiu::impl::Sum_const&)_1_,matchit::impl::IdBlock<mathiu::impl::Sum>::get()const::_lambda(mathiu::impl::Sum_const*)_1_,matchit::impl::IdBlock<mathiu::impl::Sum>::get()const::_lambda(mathiu::impl::Sum*)_1_,matchit::impl::IdBlock<mathiu::impl::Sum>::get()const::_lambda(std::monostate_const&)_1_>,std::variant<std::monostate,mathiu::impl::Sum,mathiu::impl::Sum*,mathiu::impl::Sum_const*>const&>
                        ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1189:33)>
                          *)local_2f8,&(pIVar9->super_IdBlockBase<mathiu::impl::Sum>).mVariant);
    p_Var8 = local_178;
    p_Var15 = &(pSVar10->super_ExprPtrMap)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var11 != p_Var15) {
      iVar13 = 0;
      do {
        IVar4 = degreeMonomial((ExprPtr *)&p_Var11[1]._M_left,(Set *)p_Var8);
        if (iVar13 < IVar4) {
          iVar13 = IVar4;
        }
        p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
      } while ((_Rb_tree_header *)p_Var11 != p_Var15);
    }
  }
  if (IVar12 == kCANCEL) {
    iVar13 = degreeMonomial(local_2d0,(Set *)&local_280);
  }
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
                       *)&_Stack_1d8);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
                       *)&local_240);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
                       *)((long)&local_170.mPattern.mPatterns.
                                 super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>
                                 .
                                 super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>
                                 .
                                 super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>,_false>
                         + 8));
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
  ::~_Variant_storage(&local_108);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
                       *)local_2c8);
  std::
  _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  ::~_Rb_tree(&local_280);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
                       *)local_78);
  return iVar13;
}

Assistant:

Integer degree(ExprPtr const &ex, ExprPtr const &varSet)
    {
#if DEBUG
        std::cout << "degree: " << toString(ex) << ",\t" << toString(varSet) << std::endl;
#endif // DEBUG

        using namespace matchit;
        Id<Set> iSet;
        auto const varSet_ = match(*varSet)(
            pattern | as<Set>(iSet) = [&]
            { return *iSet; },
            pattern | _ = [&]
            { return Set{{{varSet}}}; });

        Id<Sum> iS;
        return match(*ex)(
            pattern | as<Sum>(iS) = [&]
            { return std::accumulate((*iS).begin(), (*iS).end(), 0, [&](Integer sum, auto &&e)
                                     { return std::max(sum, degreeMonomial(e.second, varSet_)); }); },
            pattern | _ = [&]
            { return degreeMonomial(ex, varSet_); });
    }